

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

void __thiscall
iDynTree::PrismaticJoint::computeChildVelAcc
          (PrismaticJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,VectorDynSize *jntAcc,
          LinkVelArray *linkVels,LinkAccArray *linkAccs,LinkIndex child,LinkIndex parent)

{
  ulong uVar1;
  Twist *pTVar2;
  SpatialAcc *this_00;
  VectorDynSize *in_RCX;
  VectorDynSize *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Transform *child_X_parent;
  double d2dist;
  double ddist;
  Twist local_288 [48];
  Twist local_258 [48];
  SpatialMotionVector local_228;
  SpatialAcc local_1f8;
  SpatialAcc local_1c8;
  SpatialAcc local_198;
  SpatialAcc local_168;
  Twist local_138 [48];
  Transform local_108 [48];
  Twist local_d8 [48];
  SpatialMotionVector local_a8;
  undefined1 local_78 [48];
  Twist *local_48;
  double local_40;
  double local_38;
  VectorDynSize *local_20;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RDI + 0xc0))();
  local_38 = (double)iDynTree::VectorDynSize::operator()(in_RDX,uVar1);
  uVar1 = (**(code **)(*in_RDI + 0xc0))();
  local_40 = (double)iDynTree::VectorDynSize::operator()(local_20,uVar1);
  local_48 = (Twist *)(**(code **)(*in_RDI + 0x50))
                                (in_RDI,local_10,in_stack_00000008,in_stack_00000010);
  (**(code **)(*in_RDI + 0x60))(local_78,in_RDI,0,in_stack_00000008,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_a8,local_38);
  pTVar2 = local_48;
  LinkVelArray::operator()((LinkVelArray *)local_20,(LinkIndex)in_RDX);
  iDynTree::Transform::operator*(local_108,pTVar2);
  iDynTree::Twist::Twist(local_138,&local_a8);
  iDynTree::Twist::operator+(local_d8,(Twist *)local_108);
  pTVar2 = LinkVelArray::operator()((LinkVelArray *)local_20,(LinkIndex)in_RDX);
  iDynTree::Twist::operator=(pTVar2,local_d8);
  pTVar2 = local_48;
  LinkAccArray::operator()((LinkAccArray *)local_20,(LinkIndex)in_RDX);
  iDynTree::Transform::operator*((Transform *)&local_1c8,(SpatialAcc *)pTVar2);
  iDynTree::SpatialMotionVector::operator*(&local_228,local_40);
  iDynTree::SpatialAcc::SpatialAcc(&local_1f8,&local_228);
  iDynTree::SpatialAcc::operator+(&local_198,&local_1c8);
  pTVar2 = LinkVelArray::operator()((LinkVelArray *)local_20,(LinkIndex)in_RDX);
  iDynTree::Twist::Twist(local_288,&local_a8);
  iDynTree::Twist::operator*(local_258,pTVar2);
  iDynTree::SpatialAcc::operator+(&local_168,&local_198);
  this_00 = LinkAccArray::operator()((LinkAccArray *)local_20,(LinkIndex)in_RDX);
  iDynTree::SpatialAcc::operator=(this_00,&local_168);
  return;
}

Assistant:

void PrismaticJoint::computeChildVelAcc(const VectorDynSize & jntPos,
                                       const VectorDynSize & jntVel,
                                       const VectorDynSize & jntAcc,
                                       LinkVelArray & linkVels,
                                       LinkAccArray & linkAccs,
                                       const LinkIndex child, const LinkIndex parent) const
{
    double ddist = jntVel(this->getDOFsOffset());
    double d2dist = jntAcc(this->getDOFsOffset());

    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);

    // Propagate twist and spatial acceleration: for a prismatic joint (as for any 1 dof joint)
    // we implement equation 5.14 and 5.15 of Feathestone RBDA, 2008
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);

    SpatialMotionVector vj = S*ddist;
    linkVels(child) = child_X_parent*linkVels(parent) + vj;
    linkAccs(child) = child_X_parent*linkAccs(parent) + S*d2dist + linkVels(child)*vj;

    return;
}